

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowFocus(char *name)

{
  ImGuiContext *pIVar1;
  ImU32 key;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (name == (char *)0x0) {
    if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
      GImGui->NavWindow = (ImGuiWindow *)0x0;
      pIVar1->NavInitRequest = false;
      pIVar1->NavId = 0;
      pIVar1->NavIdIsAlive = false;
      pIVar1->NavLayer = 0;
    }
  }
  else {
    key = ImHash(name,0,0);
    window = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar1->WindowsById,key);
    if (window != (ImGuiWindow *)0x0) {
      FocusWindow(window);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowFocus(const char* name)
{
    if (name)
    {
        if (ImGuiWindow* window = FindWindowByName(name))
            FocusWindow(window);
    }
    else
    {
        FocusWindow(NULL);
    }
}